

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O1

int __thiscall QTreeView::indexRowSizeHint(QTreeView *this,QModelIndex *index)

{
  int iVar1;
  QAbstractItemViewPrivate *this_00;
  Data *pDVar2;
  QAbstractItemModel *pQVar3;
  Data *this_01;
  bool bVar4;
  int iVar5;
  int iVar6;
  LayoutDirection LVar7;
  int iVar8;
  QEditorInfo *pQVar9;
  Node<QWidget_*,_QHashDummyValue> *pNVar10;
  int extraout_var;
  QSize QVar11;
  QSize QVar12;
  long *plVar13;
  int extraout_var_00;
  int iVar14;
  Representation RVar15;
  int column;
  long in_FS_OFFSET;
  QWidget *editor;
  QStyleOptionViewItem option;
  QWidget *local_150;
  QModelIndex local_148;
  undefined1 *local_128;
  undefined1 *puStack_120;
  undefined1 *local_118;
  QStyleOptionViewItem local_108;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = index->r;
  iVar5 = 0;
  RVar15.m_i = 0;
  if (((((-1 < iVar1) && (RVar15.m_i = iVar5, -1 < index->c)) &&
       (this_00 = *(QAbstractItemViewPrivate **)
                   &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8, (index->m).ptr == this_00->model)) &&
      ((pDVar2 = (this_00->itemDelegate).wp.d, pDVar2 != (Data *)0x0 && (*(int *)(pDVar2 + 4) != 0))
      )) && ((this_00->itemDelegate).wp.value != (QObject *)0x0)) {
    iVar5 = QHeaderView::count(*(QHeaderView **)
                                &this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                                 super_QWidgetPrivate.field_0x50);
    local_118 = &DAT_aaaaaaaaaaaaaaaa;
    local_128 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_120 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar3 = (index->m).ptr;
    if (pQVar3 == (QAbstractItemModel *)0x0) {
      local_128 = (undefined1 *)0xffffffffffffffff;
      puStack_120 = (undefined1 *)0x0;
      local_118 = (undefined1 *)0x0;
    }
    else {
      (**(code **)(*(long *)pQVar3 + 0x68))(&local_128,pQVar3,index);
    }
    if ((iVar5 == 0) ||
       ((((this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.data)
         ->widget_attributes & 0x8000) == 0)) {
      iVar6 = (**(code **)(*(long *)this_00->model + 0x80))(this_00->model,&local_128);
      iVar8 = -1;
    }
    else {
      iVar8 = QHeaderView::visualIndexAt
                        (*(QHeaderView **)
                          &this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                           super_QWidgetPrivate.field_0x50,0);
      iVar6 = iVar5;
    }
    LVar7 = QWidget::layoutDirection((QWidget *)this);
    iVar6 = iVar6 + -1;
    iVar14 = iVar8;
    if (iVar8 == -1) {
      iVar8 = 0;
      iVar14 = iVar6;
    }
    if (LVar7 == RightToLeft) {
      iVar6 = 0;
      iVar8 = iVar14;
    }
    iVar14 = iVar8;
    if (iVar8 < iVar6) {
      iVar14 = iVar6;
    }
    if (iVar8 <= iVar6) {
      iVar6 = iVar8;
    }
    memset(&local_108,0xaa,0xd0);
    QStyleOptionViewItem::QStyleOptionViewItem(&local_108);
    (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget + 0x2f8))(this,&local_108);
    local_108.super_QStyleOption.rect.x2.m_i = local_108.super_QStyleOption.rect.x1.m_i + -2;
    RVar15.m_i = -1;
    do {
      iVar8 = iVar6;
      if (iVar5 != 0) {
        iVar8 = QHeaderView::logicalIndex
                          (*(QHeaderView **)
                            &this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                             super_QWidgetPrivate.field_0x50,iVar6);
      }
      bVar4 = QHeaderView::isSectionHidden
                        (*(QHeaderView **)
                          &this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                           super_QWidgetPrivate.field_0x50,iVar8);
      if (!bVar4) {
        local_148.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_148.r = -0x55555556;
        local_148.c = -0x55555556;
        local_148.i._0_4_ = 0xaaaaaaaa;
        local_148.i._4_4_ = 0xaaaaaaaa;
        (**(code **)(*(long *)this_00->model + 0x60))
                  (&local_148,this_00->model,iVar1,iVar8,&local_128);
        if (((-1 < local_148.r) && (-1 < local_148.c)) &&
           (local_148.m.ptr != (QAbstractItemModel *)0x0)) {
          pQVar9 = QAbstractItemViewPrivate::editorForIndex(this_00,&local_148);
          pDVar2 = (pQVar9->widget).wp.d;
          if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
            local_150 = (QWidget *)0x0;
          }
          else {
            local_150 = (QWidget *)(pQVar9->widget).wp.value;
          }
          if (((local_150 != (QWidget *)0x0) &&
              (this_01 = (this_00->persistent).q_hash.d, this_01 != (Data *)0x0)) &&
             (pNVar10 = QHashPrivate::Data<QHashPrivate::Node<QWidget*,QHashDummyValue>>::
                        findNode<QWidget*>((Data<QHashPrivate::Node<QWidget*,QHashDummyValue>> *)
                                           this_01,&local_150),
             pNVar10 != (Node<QWidget_*,_QHashDummyValue> *)0x0)) {
            (**(code **)(*(long *)local_150 + 0x70))();
            if (RVar15.m_i <= extraout_var) {
              RVar15.m_i = extraout_var;
            }
            QVar11 = QWidget::minimumSize(local_150);
            QVar12 = QWidget::maximumSize(local_150);
            if (QVar12.ht.m_i.m_i <= RVar15.m_i) {
              RVar15.m_i = QVar12.ht.m_i.m_i;
            }
            if (RVar15.m_i <= QVar11.ht.m_i.m_i) {
              RVar15.m_i = QVar11.ht.m_i.m_i;
            }
          }
          plVar13 = (long *)(**(code **)(*(long *)&(this->super_QAbstractItemView).
                                                   super_QAbstractScrollArea.super_QFrame.
                                                   super_QWidget + 0x208))(this,&local_148);
          (**(code **)(*plVar13 + 0x68))(plVar13,&local_108,&local_148);
          if (RVar15.m_i <= extraout_var_00) {
            RVar15.m_i = extraout_var_00;
          }
        }
      }
      iVar6 = iVar6 + 1;
    } while (iVar14 + 1 != iVar6);
    QBrush::~QBrush(&local_108.backgroundBrush);
    if (&(local_108.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_108.text.d.d)->super_QArrayData,2,0x10);
      }
    }
    QIcon::~QIcon(&local_108.icon);
    QLocale::~QLocale(&local_108.locale);
    QFont::~QFont(&local_108.font);
    QStyleOption::~QStyleOption(&local_108.super_QStyleOption);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return RVar15.m_i;
}

Assistant:

int QTreeView::indexRowSizeHint(const QModelIndex &index) const
{
    Q_D(const QTreeView);
    if (!d->isIndexValid(index) || !d->itemDelegate)
        return 0;

    int start = -1;
    int end = -1;
    int indexRow = index.row();
    int count = d->header->count();
    bool emptyHeader = (count == 0);
    QModelIndex parent = index.parent();

    if (count && isVisible()) {
        // If the sections have moved, we end up checking too many or too few
        start = d->header->visualIndexAt(0);
    } else {
        // If the header has not been laid out yet, we use the model directly
        count = d->model->columnCount(parent);
    }

    if (isRightToLeft()) {
        start = (start == -1 ? count - 1 : start);
        end = 0;
    } else {
        start = (start == -1 ? 0 : start);
        end = count - 1;
    }

    if (end < start)
        qSwap(end, start);

    int height = -1;
    QStyleOptionViewItem option;
    initViewItemOption(&option);
   // ### If we want word wrapping in the items,
    // ### we need to go through all the columns
    // ### and set the width of the column

    // Hack to speed up the function
    option.rect.setWidth(-1);

    for (int column = start; column <= end; ++column) {
        int logicalColumn = emptyHeader ? column : d->header->logicalIndex(column);
        if (d->header->isSectionHidden(logicalColumn))
            continue;
        QModelIndex idx = d->model->index(indexRow, logicalColumn, parent);
        if (idx.isValid()) {
            QWidget *editor = d->editorForIndex(idx).widget.data();
            if (editor && d->persistent.contains(editor)) {
                height = qMax(height, editor->sizeHint().height());
                int min = editor->minimumSize().height();
                int max = editor->maximumSize().height();
                height = qBound(min, height, max);
            }
            int hint = itemDelegateForIndex(idx)->sizeHint(option, idx).height();
            height = qMax(height, hint);
        }
    }

    return height;
}